

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::LogQueryPathSetting::ResetLocal(ClientContext *context)

{
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> _Var1;
  unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
  uVar2;
  ClientData *pCVar3;
  ClientData CStack_d8;
  
  pCVar3 = ClientData::Get(context);
  ClientData::ClientData(&CStack_d8,context);
  uVar2.
  super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
  .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl =
       CStack_d8.log_query_writer.
       super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
       .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl;
  CStack_d8.log_query_writer.
  super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
  .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>)
       (__uniq_ptr_data<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true,_true>
        )0x0;
  _Var1._M_head_impl =
       (pCVar3->log_query_writer).
       super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
       .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl;
  (pCVar3->log_query_writer).
  super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
  .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl =
       (BufferedFileWriter *)
       uVar2.
       super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
       .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (BufferedFileWriter *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))();
  }
  ClientData::~ClientData(&CStack_d8);
  return;
}

Assistant:

void LogQueryPathSetting::ResetLocal(ClientContext &context) {
	auto &client_data = ClientData::Get(context);
	// TODO: verify that this does the right thing
	client_data.log_query_writer = std::move(ClientData(context).log_query_writer);
}